

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTaskManager.hpp
# Opt level: O2

void __thiscall sftm::CTaskManager::CTaskManager(CTaskManager *this)

{
  std::array<sftm::CWorker,_64UL>::array(&this->m_workers);
  this->m_nWorkerCount = 0;
  std::condition_variable::condition_variable(&this->m_cvWorkerIdle);
  *(undefined8 *)((long)&(this->m_mtxWorkerIdle).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mtxWorkerIdle).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mtxWorkerIdle).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mtxWorkerIdle).super___mutex_base._M_mutex + 8) = 0;
  (this->m_mtxWorkerIdle).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

CTaskManager() noexcept {}